

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

QString * __thiscall
CPP::WriteInitialization::noTrCall
          (QString *__return_storage_ptr__,WriteInitialization *this,DomString *str,
          QString *defaultString)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  _string<true> local_68;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (defaultString->d).d;
  pcVar2 = (defaultString->d).ptr;
  qVar3 = (defaultString->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (str == (DomString *)0x0) {
    local_38.d = pDVar1;
    local_38.ptr = pcVar2;
    local_38.size = qVar3;
    if ((defaultString->d).size == 0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      goto LAB_001266e1;
    }
  }
  else {
    local_38.d = (str->m_text).d.d;
    local_38.ptr = (str->m_text).d.ptr;
    local_38.size = (str->m_text).d.size;
    if (local_38.d == (Data *)0x0) {
      local_38.d = (Data *)0x0;
    }
    else {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_58.d = pDVar1;
    local_58.ptr = pcVar2;
    local_58.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QTextStream::QTextStream((QTextStream *)&local_58,__return_storage_ptr__,3);
  local_68.m_indent = &this->m_dindent;
  local_68.m_value = (QString *)&local_38;
  language::_string<true>::format(&local_68,(QTextStream *)&local_58);
  QTextStream::~QTextStream((QTextStream *)&local_58);
LAB_001266e1:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString WriteInitialization::noTrCall(DomString *str, const QString &defaultString) const
{
    QString value = defaultString;
    if (!str && defaultString.isEmpty())
        return {};
    if (str)
        value = str->text();
    QString ret;
    QTextStream ts(&ret);
    ts << language::qstring(value, m_dindent);
    return ret;
}